

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bind.cc
# Opt level: O0

ostream * __thiscall
absl::lts_20250127::str_format_internal::Streamable::Print(Streamable *this,ostream *os)

{
  UntypedFormatSpecImpl format;
  bool bVar1;
  Span<const_absl::lts_20250127::str_format_internal::FormatArgImpl> local_48;
  void *local_38;
  size_t local_30;
  FormatRawSinkImpl local_28;
  ostream *local_18;
  ostream *os_local;
  Streamable *this_local;
  
  local_18 = os;
  os_local = (ostream *)this;
  FormatRawSinkImpl::FormatRawSinkImpl<std::basic_ostream<char,_std::char_traits<char>_>,_nullptr>
            (&local_28,os);
  local_38 = this->format_->data_;
  local_30 = this->format_->size_;
  Span<absl::lts_20250127::str_format_internal::FormatArgImpl_const>::
  Span<absl::lts_20250127::InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>,void,absl::lts_20250127::InlinedVector<absl::lts_20250127::str_format_internal::FormatArgImpl,4ul,std::allocator<absl::lts_20250127::str_format_internal::FormatArgImpl>>,int>
            ((Span<absl::lts_20250127::str_format_internal::FormatArgImpl_const> *)&local_48,
             &this->args_);
  format.size_ = local_30;
  format.data_ = local_38;
  bVar1 = FormatUntyped(local_28,format,local_48);
  if (!bVar1) {
    std::ios::setstate((int)local_18 + (int)*(undefined8 *)(*(long *)local_18 + -0x18));
  }
  return local_18;
}

Assistant:

std::ostream& Streamable::Print(std::ostream& os) const {
  if (!FormatUntyped(&os, format_, args_)) os.setstate(std::ios::failbit);
  return os;
}